

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  pointer ppFVar1;
  char cVar2;
  int iVar3;
  int *piVar4;
  ostream *poVar5;
  char *pcVar6;
  string *psVar7;
  bool bVar8;
  int i;
  ulong uVar9;
  FileOutputStream out;
  undefined4 local_a8 [2];
  undefined8 local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  undefined8 local_88;
  FileDescriptorSet file_set;
  RepeatedPtrFieldBase local_50;
  
  google::protobuf::FileDescriptorSet::FileDescriptorSet(&file_set);
  if (this->imports_in_descriptor_set_ == false) {
    for (uVar9 = 0;
        uVar9 < (ulong)((long)(parsed_files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(parsed_files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
      internal::RepeatedPtrFieldBase::
      Add<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                (&local_50);
      google::protobuf::FileDescriptor::CopyTo
                ((FileDescriptorProto *)
                 (parsed_files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar9]);
      if (this->source_info_in_descriptor_set_ == true) {
        google::protobuf::FileDescriptor::CopySourceCodeInfoTo
                  ((FileDescriptorProto *)
                   (parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar9]);
      }
    }
  }
  else {
    local_98 = local_a8;
    local_a8[0] = 0;
    local_a0 = 0;
    local_88 = 0;
    local_90 = local_98;
    for (uVar9 = 0;
        ppFVar1 = (parsed_files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(parsed_files->
                              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
        uVar9 = uVar9 + 1) {
      GetTransitiveDependencies
                (ppFVar1[uVar9],this->source_info_in_descriptor_set_,
                 (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&out,(RepeatedPtrField<google::protobuf::FileDescriptorProto> *)&local_50);
    }
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)&out);
  }
  psVar7 = &this->descriptor_set_name_;
  do {
    iVar3 = open((psVar7->_M_dataplus)._M_p,0x241,0x1b6);
    if (-1 < iVar3) {
      google::protobuf::io::FileOutputStream::FileOutputStream(&out,iVar3,-1);
      cVar2 = google::protobuf::MessageLite::SerializeToZeroCopyStream
                        ((ZeroCopyOutputStream *)&file_set);
      if (cVar2 == '\0') {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)psVar7);
        poVar5 = std::operator<<(poVar5,": ");
        pcVar6 = strerror((int)local_98);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
        google::protobuf::io::FileOutputStream::Close();
LAB_0014047b:
        bVar8 = false;
      }
      else {
        cVar2 = google::protobuf::io::FileOutputStream::Close();
        bVar8 = true;
        if (cVar2 == '\0') {
          poVar5 = std::operator<<((ostream *)&std::cerr,(string *)psVar7);
          poVar5 = std::operator<<(poVar5,": ");
          pcVar6 = strerror((int)local_98);
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar5);
          goto LAB_0014047b;
        }
      }
      google::protobuf::io::FileOutputStream::~FileOutputStream(&out);
      goto LAB_00140487;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  perror((psVar7->_M_dataplus)._M_p);
  bVar8 = false;
LAB_00140487:
  google::protobuf::FileDescriptorSet::~FileDescriptorSet(&file_set);
  return bVar8;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const vector<const FileDescriptor*> parsed_files) {
  FileDescriptorSet file_set;

  if (imports_in_descriptor_set_) {
    set<const FileDescriptor*> already_seen;
    for (int i = 0; i < parsed_files.size(); i++) {
      GetTransitiveDependencies(parsed_files[i],
                                source_info_in_descriptor_set_,
                                &already_seen, file_set.mutable_file());
    }
  } else {
    for (int i = 0; i < parsed_files.size(); i++) {
      FileDescriptorProto* file_proto = file_set.add_file();
      parsed_files[i]->CopyTo(file_proto);
      if (source_info_in_descriptor_set_) {
        parsed_files[i]->CopySourceCodeInfoTo(file_proto);
      }
    }
  }

  int fd;
  do {
    fd = open(descriptor_set_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    return false;
  }

  return true;
}